

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall google::protobuf::DescriptorProto::IsInitialized(DescriptorProto *this)

{
  MessageOptions *pMVar1;
  bool bVar2;
  
  bVar2 = internal::AllAreInitialized<google::protobuf::FieldDescriptorProto>(&this->field_);
  if ((((!bVar2) ||
       (bVar2 = internal::AllAreInitialized<google::protobuf::DescriptorProto>(&this->nested_type_),
       !bVar2)) ||
      (bVar2 = internal::AllAreInitialized<google::protobuf::EnumDescriptorProto>(&this->enum_type_)
      , !bVar2)) ||
     (((bVar2 = internal::AllAreInitialized<google::protobuf::DescriptorProto_ExtensionRange>
                          (&this->extension_range_), !bVar2 ||
       (bVar2 = internal::AllAreInitialized<google::protobuf::FieldDescriptorProto>
                          (&this->extension_), !bVar2)) ||
      (bVar2 = internal::AllAreInitialized<google::protobuf::OneofDescriptorProto>
                         (&this->oneof_decl_), !bVar2)))) {
    return false;
  }
  bVar2 = _internal_has_options(this);
  if (bVar2) {
    pMVar1 = this->options_;
    bVar2 = internal::ExtensionSet::IsInitialized(&pMVar1->_extensions_);
    if (!bVar2) {
      return false;
    }
    bVar2 = internal::AllAreInitialized<google::protobuf::UninterpretedOption>
                      (&pMVar1->uninterpreted_option_);
    if (!bVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool DescriptorProto::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(field_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(nested_type_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(enum_type_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(extension_range_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(extension_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(oneof_decl_)) return false;
  if (_internal_has_options()) {
    if (!options_->IsInitialized()) return false;
  }
  return true;
}